

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bssrdf.cpp
# Opt level: O0

void __thiscall
pbrt::BSSRDFTable::BSSRDFTable(BSSRDFTable *this,int nRhoSamples,int nRadiusSamples,Allocator alloc)

{
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *this_00;
  polymorphic_allocator<float> *this_01;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  polymorphic_allocator<std::byte> *in_stack_ffffffffffffff28;
  polymorphic_allocator<float> *in_stack_ffffffffffffff30;
  size_t in_stack_ffffffffffffff38;
  undefined1 *count;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *in_stack_ffffffffffffff40;
  undefined1 local_50 [56];
  int local_18;
  int local_14;
  
  local_18 = in_EDX;
  local_14 = in_ESI;
  pstd::pmr::polymorphic_allocator<float>::polymorphic_allocator<std::byte>
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::vector
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  pstd::pmr::polymorphic_allocator<float>::polymorphic_allocator<std::byte>
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::vector
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  pstd::pmr::polymorphic_allocator<float>::polymorphic_allocator<std::byte>
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::vector
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  this_00 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)(in_RDI + 0x60);
  pstd::pmr::polymorphic_allocator<float>::polymorphic_allocator<std::byte>
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::vector
            (this_00,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  this_01 = (polymorphic_allocator<float> *)(long)(local_18 * local_14);
  count = local_50;
  pstd::pmr::polymorphic_allocator<float>::polymorphic_allocator<std::byte>
            (this_01,(polymorphic_allocator<std::byte> *)(in_RDI + 0x80));
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::vector
            (this_00,(size_t)count,this_01);
  return;
}

Assistant:

BSSRDFTable::BSSRDFTable(int nRhoSamples, int nRadiusSamples, Allocator alloc)
    : rhoSamples(nRhoSamples, alloc),
      radiusSamples(nRadiusSamples, alloc),
      profile(nRadiusSamples * nRhoSamples, alloc),
      rhoEff(nRhoSamples, alloc),
      profileCDF(nRadiusSamples * nRhoSamples, alloc) {}